

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOAnimation.cpp
# Opt level: O0

void __thiscall Assimp::LWO::AnimResolver::UpdateAnimRangeSetup(AnimResolver *this)

{
  float fVar1;
  float fVar2;
  bool bVar3;
  byte bVar4;
  reference pEVar5;
  reference pvVar6;
  size_type __n;
  iterator __first;
  iterator __last;
  reference pEVar7;
  size_type sVar8;
  reference pKVar9;
  double __y;
  double dVar10;
  double dVar11;
  Key *local_188;
  double tmp;
  double dStack_170;
  uint tt;
  double cur_minus;
  Key *local_160;
  __normal_iterator<Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
  local_158;
  Key *local_150;
  __normal_iterator<Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
  local_148;
  Key *local_140;
  size_t local_138;
  Key *local_130;
  __normal_iterator<Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
  local_128;
  Key *local_120;
  uint local_118;
  byte local_111;
  uint i;
  bool reverse;
  Key *local_108;
  uint local_fc;
  __normal_iterator<Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
  _Stack_f8;
  uint num;
  Key *local_f0;
  __normal_iterator<Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
  local_e8;
  __normal_iterator<Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
  local_e0;
  __normal_iterator<Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
  local_d8;
  Key *local_d0;
  Key local_c8;
  __normal_iterator<Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
  local_a0;
  const_iterator local_98;
  __normal_iterator<Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
  local_90;
  __normal_iterator<Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
  local_88;
  size_type local_80;
  size_t ofs;
  iterator m;
  __normal_iterator<Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
  local_58;
  iterator n;
  double start_time;
  float value_delta;
  size_t old_size;
  double delta;
  double my_last;
  double my_first;
  _Self local_18;
  iterator it;
  AnimResolver *this_local;
  
  it._M_node = (_List_node_base *)this;
  local_18._M_node =
       (_List_node_base *)
       std::__cxx11::list<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>::begin
                 (this->envelopes);
  while( true ) {
    my_first = (double)std::__cxx11::
                       list<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>::end
                                 (this->envelopes);
    bVar3 = std::operator!=(&local_18,(_Self *)&my_first);
    if (!bVar3) break;
    pEVar5 = std::_List_iterator<Assimp::LWO::Envelope>::operator*(&local_18);
    bVar3 = std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::empty(&pEVar5->keys);
    if (!bVar3) {
      pEVar5 = std::_List_iterator<Assimp::LWO::Envelope>::operator*(&local_18);
      pvVar6 = std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::front
                         (&pEVar5->keys);
      dVar11 = pvVar6->time;
      pEVar5 = std::_List_iterator<Assimp::LWO::Envelope>::operator*(&local_18);
      pvVar6 = std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::back(&pEVar5->keys)
      ;
      __y = pvVar6->time - dVar11;
      pEVar5 = std::_List_iterator<Assimp::LWO::Envelope>::operator*(&local_18);
      __n = std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::size(&pEVar5->keys);
      pEVar5 = std::_List_iterator<Assimp::LWO::Envelope>::operator*(&local_18);
      pvVar6 = std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::back(&pEVar5->keys)
      ;
      fVar1 = pvVar6->value;
      pEVar5 = std::_List_iterator<Assimp::LWO::Envelope>::operator*(&local_18);
      pvVar6 = std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::front
                         (&pEVar5->keys);
      fVar2 = pvVar6->value;
      pEVar5 = std::_List_iterator<Assimp::LWO::Envelope>::operator*(&local_18);
      if (pEVar5->pre - PrePostBehaviour_Repeat < 3) {
        dVar10 = fmod(dVar11 - this->first,__y);
        n._M_current = (Key *)(__y - dVar10);
        pEVar5 = std::_List_iterator<Assimp::LWO::Envelope>::operator*(&local_18);
        __first = std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::begin
                            (&pEVar5->keys);
        pEVar5 = std::_List_iterator<Assimp::LWO::Envelope>::operator*(&local_18);
        __last = std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::end
                           (&pEVar5->keys);
        m = n;
        local_58 = std::
                   find_if<__gnu_cxx::__normal_iterator<Assimp::LWO::Key*,std::vector<Assimp::LWO::Key,std::allocator<Assimp::LWO::Key>>>,Assimp::LWO::AnimResolver::UpdateAnimRangeSetup()::__0>
                             (__first._M_current,__last._M_current,n._M_current);
        __gnu_cxx::
        __normal_iterator<Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
        ::__normal_iterator((__normal_iterator<Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
                             *)&ofs);
        local_80 = 0;
        pEVar5 = std::_List_iterator<Assimp::LWO::Envelope>::operator*(&local_18);
        local_88._M_current =
             (Key *)std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::end
                              (&pEVar5->keys);
        bVar3 = __gnu_cxx::operator!=(&local_58,&local_88);
        if (bVar3) {
          pEVar5 = std::_List_iterator<Assimp::LWO::Envelope>::operator*(&local_18);
          local_90._M_current =
               (Key *)std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::end
                                (&pEVar5->keys);
          local_80 = __gnu_cxx::operator-(&local_90,&local_58);
          pEVar5 = std::_List_iterator<Assimp::LWO::Envelope>::operator*(&local_18);
          pEVar7 = std::_List_iterator<Assimp::LWO::Envelope>::operator*(&local_18);
          local_a0._M_current =
               (Key *)std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::begin
                                (&pEVar7->keys);
          __gnu_cxx::
          __normal_iterator<Assimp::LWO::Key_const*,std::vector<Assimp::LWO::Key,std::allocator<Assimp::LWO::Key>>>
          ::__normal_iterator<Assimp::LWO::Key*>
                    ((__normal_iterator<Assimp::LWO::Key_const*,std::vector<Assimp::LWO::Key,std::allocator<Assimp::LWO::Key>>>
                      *)&local_98,&local_a0);
          sVar8 = local_80;
          Key::Key(&local_c8);
          local_d0 = (Key *)std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::insert
                                      (&pEVar5->keys,local_98,sVar8,&local_c8);
          pEVar5 = std::_List_iterator<Assimp::LWO::Envelope>::operator*(&local_18);
          local_e0._M_current =
               (Key *)std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::end
                                (&pEVar5->keys);
          local_d8 = __gnu_cxx::
                     __normal_iterator<Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
                     ::operator-(&local_e0,local_80);
          pEVar5 = std::_List_iterator<Assimp::LWO::Envelope>::operator*(&local_18);
          local_e8._M_current =
               (Key *)std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::end
                                (&pEVar5->keys);
          pEVar5 = std::_List_iterator<Assimp::LWO::Envelope>::operator*(&local_18);
          local_f0 = (Key *)std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::begin
                                      (&pEVar5->keys);
          _Stack_f8 = std::
                      copy<__gnu_cxx::__normal_iterator<Assimp::LWO::Key*,std::vector<Assimp::LWO::Key,std::allocator<Assimp::LWO::Key>>>,__gnu_cxx::__normal_iterator<Assimp::LWO::Key*,std::vector<Assimp::LWO::Key,std::allocator<Assimp::LWO::Key>>>>
                                (local_d8,local_e8,
                                 (__normal_iterator<Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
                                  )local_f0);
        }
        local_fc = (uint)(long)((dVar11 - this->first) / __y);
        pEVar5 = std::_List_iterator<Assimp::LWO::Envelope>::operator*(&local_18);
        pEVar7 = std::_List_iterator<Assimp::LWO::Envelope>::operator*(&local_18);
        sVar8 = std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::size
                          (&pEVar7->keys);
        std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::resize
                  (&pEVar5->keys,sVar8 + local_fc * __n);
        pEVar5 = std::_List_iterator<Assimp::LWO::Envelope>::operator*(&local_18);
        _i = std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::begin(&pEVar5->keys);
        local_108 = (Key *)__gnu_cxx::
                           __normal_iterator<Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
                           ::operator+((__normal_iterator<Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
                                        *)&i,local_80);
        local_111 = 0;
        local_58 = (__normal_iterator<Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
                    )local_108;
        for (local_118 = 0; local_118 < local_fc; local_118 = local_118 + 1) {
          local_120 = (Key *)__gnu_cxx::
                             __normal_iterator<Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
                             ::operator+(&local_58,__n * (local_118 + 1));
          local_128._M_current = local_58._M_current;
          ofs = (size_t)local_120;
          local_130 = (Key *)__gnu_cxx::
                             __normal_iterator<Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
                             ::operator+(&local_58,__n);
          local_138 = ofs;
          local_140 = (Key *)std::
                             copy<__gnu_cxx::__normal_iterator<Assimp::LWO::Key*,std::vector<Assimp::LWO::Key,std::allocator<Assimp::LWO::Key>>>,__gnu_cxx::__normal_iterator<Assimp::LWO::Key*,std::vector<Assimp::LWO::Key,std::allocator<Assimp::LWO::Key>>>>
                                       (local_128,
                                        (__normal_iterator<Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
                                         )local_130,
                                        (__normal_iterator<Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
                                         )ofs);
          pEVar5 = std::_List_iterator<Assimp::LWO::Envelope>::operator*(&local_18);
          if ((pEVar5->pre == PrePostBehaviour_Oscillate) &&
             (bVar4 = local_111 ^ 0xff, local_111 = bVar4 & 1, (bVar4 & 1) != 0)) {
            local_148._M_current = (Key *)ofs;
            local_158 = __gnu_cxx::
                        __normal_iterator<Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
                        ::operator+((__normal_iterator<Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
                                     *)&ofs,__n);
            local_150 = (Key *)__gnu_cxx::
                               __normal_iterator<Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
                               ::operator-(&local_158,1);
            std::
            reverse<__gnu_cxx::__normal_iterator<Assimp::LWO::Key*,std::vector<Assimp::LWO::Key,std::allocator<Assimp::LWO::Key>>>>
                      (local_148,
                       (__normal_iterator<Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
                        )local_150);
          }
        }
        pEVar5 = std::_List_iterator<Assimp::LWO::Envelope>::operator*(&local_18);
        cur_minus = (double)std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::end
                                      (&pEVar5->keys);
        local_160 = (Key *)__gnu_cxx::
                           __normal_iterator<Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
                           ::operator-((__normal_iterator<Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
                                        *)&cur_minus,__n + 1);
        tmp._4_4_ = 1;
        dVar11 = __y * (double)(local_fc + 1);
        local_58 = (__normal_iterator<Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
                    )local_160;
        for (dStack_170 = __y; dStack_170 <= dVar11; dStack_170 = __y + dStack_170) {
          if ((__y != dVar11) || (NAN(__y) || NAN(dVar11))) {
            local_188 = (Key *)__gnu_cxx::
                               __normal_iterator<Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
                               ::operator-(&local_58,__n + 1);
          }
          else {
            pEVar5 = std::_List_iterator<Assimp::LWO::Envelope>::operator*(&local_18);
            local_188 = (Key *)std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::
                               begin(&pEVar5->keys);
          }
          ofs = (size_t)local_188;
          while (bVar3 = __gnu_cxx::operator!=
                                   ((__normal_iterator<Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
                                     *)&ofs,&local_58), bVar3) {
            pKVar9 = __gnu_cxx::
                     __normal_iterator<Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
                     ::operator*(&local_58);
            pKVar9->time = pKVar9->time - dStack_170;
            pEVar5 = std::_List_iterator<Assimp::LWO::Envelope>::operator*(&local_18);
            if (pEVar5->pre == PrePostBehaviour_OffsetRepeat) {
              pKVar9 = __gnu_cxx::
                       __normal_iterator<Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
                       ::operator*(&local_58);
              pKVar9->value = (float)tmp._4_4_ * (fVar1 - fVar2) + pKVar9->value;
            }
            __gnu_cxx::
            __normal_iterator<Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
            ::operator--(&local_58);
          }
          tmp._4_4_ = tmp._4_4_ + 1;
        }
      }
      std::_List_iterator<Assimp::LWO::Envelope>::operator*(&local_18);
    }
    std::_List_iterator<Assimp::LWO::Envelope>::operator++(&local_18);
  }
  return;
}

Assistant:

void AnimResolver::UpdateAnimRangeSetup()
{
    // XXX doesn't work yet (hangs if more than one envelope channels needs to be interpolated)

    for (std::list<LWO::Envelope>::iterator it = envelopes.begin(); it != envelopes.end(); ++it) {
        if ((*it).keys.empty()) continue;

        const double my_first = (*it).keys.front().time;
        const double my_last  = (*it).keys.back().time;

        const double delta = my_last-my_first;
        const size_t old_size = (*it).keys.size();

        const float value_delta = (*it).keys.back().value - (*it).keys.front().value;

        // NOTE: We won't handle reset, linear and constant here.
        // See DoInterpolation() for their implementation.

        // process pre behaviour
        switch ((*it).pre) {
            case LWO::PrePostBehaviour_OffsetRepeat:
            case LWO::PrePostBehaviour_Repeat:
            case LWO::PrePostBehaviour_Oscillate:
                {
                const double start_time = delta - std::fmod(my_first-first,delta);
                std::vector<LWO::Key>::iterator n = std::find_if((*it).keys.begin(),(*it).keys.end(),
                    [start_time](double t) { return start_time > t; }),m;

                size_t ofs = 0;
                if (n != (*it).keys.end()) {
                    // copy from here - don't use iterators, insert() would invalidate them
                    ofs = (*it).keys.end()-n;
                    (*it).keys.insert((*it).keys.begin(),ofs,LWO::Key());

                    std::copy((*it).keys.end()-ofs,(*it).keys.end(),(*it).keys.begin());
                }

                // do full copies. again, no iterators
                const unsigned int num = (unsigned int)((my_first-first) / delta);
                (*it).keys.resize((*it).keys.size() + num*old_size);

                n = (*it).keys.begin()+ofs;
                bool reverse = false;
                for (unsigned int i = 0; i < num; ++i) {
                    m = n+old_size*(i+1);
                    std::copy(n,n+old_size,m);

                    if ((*it).pre == LWO::PrePostBehaviour_Oscillate && (reverse = !reverse))
                        std::reverse(m,m+old_size-1);
                }

                // update time values
                n = (*it).keys.end() - (old_size+1);
                double cur_minus = delta;
                unsigned int tt = 1;
                for (const double tmp =  delta*(num+1);cur_minus <= tmp;cur_minus += delta,++tt) {
                    m = (delta == tmp ? (*it).keys.begin() :  n - (old_size+1));
                    for (;m != n; --n) {
                        (*n).time -= cur_minus;

                        // offset repeat? add delta offset to key value
                        if ((*it).pre == LWO::PrePostBehaviour_OffsetRepeat) {
                            (*n).value += tt * value_delta;
                        }
                    }
                }
                break;
                }
            default:
                // silence compiler warning
                break;
        }

        // process post behaviour
        switch ((*it).post) {

            case LWO::PrePostBehaviour_OffsetRepeat:
            case LWO::PrePostBehaviour_Repeat:
            case LWO::PrePostBehaviour_Oscillate:

                break;

            default:
                // silence compiler warning
                break;
        }
    }
}